

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

void __thiscall TRM::Edge::set_bottom(Edge *this,Vertex *v)

{
  LinkedList<TRM::Edge>::Remove<&TRM::Edge::above_prev,&TRM::Edge::above_next>
            (this,(Edge **)(this->bottom + 0x18),(Edge **)(this->bottom + 0x20));
  this->bottom = v;
  recompute(this);
  Vertex::insert_above(this->bottom,this);
  return;
}

Assistant:

void Edge::set_bottom(Vertex* v) {
  // remove this edge from bottom's above list
  LinkedList<Edge>::Remove<&Edge::above_prev, &Edge::above_next>(
      this, &bottom->edge_above.head, &bottom->edge_above.tail);
  // update bottom vertex
  bottom = v;
  // recompute line equation
  recompute();
  // insert self to new bottom's above list
  bottom->insert_above(this);
}